

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.cpp
# Opt level: O3

BasicStringView<const_char> __thiscall
Corrade::Containers::BasicStringView<const_char>::exceptPrefix
          (BasicStringView<const_char> *this,StringView prefix)

{
  int iVar1;
  ostream *output;
  Debug *this_00;
  ulong __n;
  ulong end;
  BasicStringView<const_char> BVar2;
  Error local_50;
  
  __n = prefix._sizePlusFlags & 0x3fffffffffffffff;
  end = this->_sizePlusFlags & 0x3fffffffffffffff;
  if (__n <= end) {
    iVar1 = bcmp(this->_data,prefix._data,__n);
    if (iVar1 == 0) {
      BVar2 = slice(this,__n,end);
      return BVar2;
    }
  }
  output = Utility::Error::defaultOutput();
  Utility::Error::Error(&local_50,output,(Flags)0x0);
  this_00 = Utility::Debug::operator<<
                      (&local_50.super_Debug,
                       "Containers::StringView::exceptPrefix(): string doesn\'t begin with");
  Utility::Debug::operator<<(this_00,prefix);
  Utility::Error::~Error(&local_50);
  abort();
}

Assistant:

BasicStringView<T> BasicStringView<T>::exceptPrefix(const StringView prefix) const {
    /* Stripping a hardcoded prefix is unlikely to be called in a tight loop --
       and the main purpose of this API is this check -- so it shouldn't be a
       debug assert */
    CORRADE_ASSERT(hasPrefix(prefix),
        "Containers::StringView::exceptPrefix(): string doesn't begin with" << prefix, {});
    return exceptPrefix(prefix.size());
}